

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::ComplainAboutBadComponent
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg,int c,bool strong)

{
  int iVar1;
  pointer pcVar2;
  int *piVar3;
  cmGeneratorTarget *pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  TargetType targetType;
  ostream *poVar7;
  string *psVar8;
  char *pcVar9;
  cmGraphEdge *ni;
  int *piVar10;
  pointer pcVar11;
  ostringstream e;
  string local_1c8;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  poVar7 = std::operator<<(&local_1a8,"The inter-target dependency graph contains the following ");
  std::operator<<(poVar7,"strongly connected component (cycle):\n");
  pcVar2 = (ccg->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = *(pointer *)
            ((long)&pcVar2[c].super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  for (piVar10 = *(int **)&pcVar2[c].super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl; piVar10 != piVar3;
      piVar10 = piVar10 + 1) {
    iVar1 = *piVar10;
    pcVar4 = (this->Targets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar1];
    poVar7 = std::operator<<(&local_1a8,"  \"");
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
    poVar7 = std::operator<<(poVar7,(string *)psVar8);
    poVar7 = std::operator<<(poVar7,"\" of type ");
    targetType = cmGeneratorTarget::GetType(pcVar4);
    psVar8 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    poVar7 = std::operator<<(poVar7,(string *)psVar8);
    std::operator<<(poVar7,"\n");
    pcVar5 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = *(pointer *)
              ((long)&pcVar5[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
    for (pcVar11 = *(pointer *)
                    &pcVar5[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                     super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        pcVar11 != pcVar6; pcVar11 = pcVar11 + 1) {
      if ((ccg->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[pcVar11->Dest] == c) {
        pcVar4 = (this->Targets).
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[pcVar11->Dest];
        poVar7 = std::operator<<(&local_1a8,"    depends on \"");
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
        poVar7 = std::operator<<(poVar7,(string *)psVar8);
        poVar7 = std::operator<<(poVar7,"\"");
        poVar7 = std::operator<<(poVar7," (");
        pcVar9 = "weak";
        if (pcVar11->Strong != false) {
          pcVar9 = "strong";
        }
        poVar7 = std::operator<<(poVar7,pcVar9);
        std::operator<<(poVar7,")\n");
      }
    }
  }
  if (strong) {
    poVar7 = std::operator<<(&local_1a8,
                             "The component contains at least one cycle consisting of strong ");
    pcVar9 = "dependencies (created by add_dependencies) that cannot be broken.";
  }
  else if (this->NoCycles == true) {
    poVar7 = std::operator<<(&local_1a8,
                             "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so ");
    pcVar9 = "cyclic dependencies are not allowed even among static libraries.";
  }
  else {
    poVar7 = std::operator<<(&local_1a8,"At least one of these targets is not a STATIC_LIBRARY.  ");
    pcVar9 = "Cyclic dependencies are allowed only among static libraries.";
  }
  std::operator<<(poVar7,pcVar9);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void cmComputeTargetDepends::ComplainAboutBadComponent(
  cmComputeComponentGraph const& ccg, int c, bool strong)
{
  // Construct the error message.
  std::ostringstream e;
  e << "The inter-target dependency graph contains the following "
    << "strongly connected component (cycle):\n";
  std::vector<NodeList> const& components = ccg.GetComponents();
  std::vector<int> const& cmap = ccg.GetComponentMap();
  NodeList const& cl = components[c];
  for (int i : cl) {
    // Get the depender.
    cmGeneratorTarget const* depender = this->Targets[i];

    // Describe the depender.
    e << "  \"" << depender->GetName() << "\" of type "
      << cmState::GetTargetTypeName(depender->GetType()) << "\n";

    // List its dependencies that are inside the component.
    EdgeList const& nl = this->InitialGraph[i];
    for (cmGraphEdge const& ni : nl) {
      int j = ni;
      if (cmap[j] == c) {
        cmGeneratorTarget const* dependee = this->Targets[j];
        e << "    depends on \"" << dependee->GetName() << "\""
          << " (" << (ni.IsStrong() ? "strong" : "weak") << ")\n";
      }
    }
  }
  if (strong) {
    // Custom command executable dependencies cannot occur within a
    // component of static libraries.  The cycle must appear in calls
    // to add_dependencies.
    e << "The component contains at least one cycle consisting of strong "
      << "dependencies (created by add_dependencies) that cannot be broken.";
  } else if (this->NoCycles) {
    e << "The GLOBAL_DEPENDS_NO_CYCLES global property is enabled, so "
      << "cyclic dependencies are not allowed even among static libraries.";
  } else {
    e << "At least one of these targets is not a STATIC_LIBRARY.  "
      << "Cyclic dependencies are allowed only among static libraries.";
  }
  cmSystemTools::Error(e.str());
}